

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpInputStream::Response> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readResponse
          (HttpInputStreamImpl *this,HttpMethod requestMethod)

{
  long lVar1;
  bool bVar2;
  byte extraout_AL;
  undefined8 *puVar3;
  Coroutine<kj::HttpInputStream::Response> *this_00;
  Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *promise;
  Response **ppRVar4;
  Own<kj::AsyncInputStream,_std::nullptr_t> *other;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  HttpInputStreamImpl *this_01;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *this_02;
  Response *value;
  HttpMethod in_EDX;
  undefined4 in_register_00000034;
  void *pvVar5;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  undefined1 local_538 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  Fault local_520;
  undefined1 local_518 [8];
  undefined1 local_510 [8];
  Response *_kj_result;
  Response response;
  HttpMethod requestMethod_local;
  HttpInputStreamImpl *this_local;
  
  puVar3 = (undefined8 *)operator_new(0x520);
  *puVar3 = readResponse;
  puVar3[1] = readResponse;
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
       (puVar3 + 0x4d);
  this_01 = (HttpInputStreamImpl *)(puVar3 + 0xa0);
  this_02 = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar3 + 0x9d);
  value = (Response *)(puVar3 + 0x94);
  this_00 = (Coroutine<kj::HttpInputStream::Response> *)(puVar3 + 2);
  puVar3[0xa1] = CONCAT44(in_register_00000034,requestMethod);
  *(HttpMethod *)(puVar3 + 0xa2) = in_EDX;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0x9a),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"readResponse",0x5a5,0x19);
  pvVar5 = (void *)puVar3[0x9c];
  kj::_::Coroutine<kj::HttpInputStream::Response>::Coroutine
            (this_00,*(SourceLocation *)(puVar3 + 0x9a));
  kj::_::Coroutine<kj::HttpInputStream::Response>::get_return_object
            ((Coroutine<kj::HttpInputStream::Response> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x519));
  if (bVar2) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x519));
    readResponseHeaders(this_01);
    promise = kj::_::Coroutine<kj::HttpInputStream::Response>::
              await_transform<kj::Promise<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>>
                        (this_00,(Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
                                  *)this_01);
    co_await<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr__,promise);
    bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar2) {
      *(undefined1 *)(puVar3 + 0xa3) = 1;
      _GLOBAL__N_1::HttpInputStreamImpl::readResponse
                ((void *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),pvVar5);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)(puVar3 + 0x8c)
                 ,__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::~Promise
              ((Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
               this_01);
    OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>::
    tryGet<kj::HttpHeaders::Response>
              ((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)local_518);
    local_510 = (undefined1  [8])
                kj::_::readMaybe<kj::HttpHeaders::Response>
                          ((Maybe<kj::HttpHeaders::Response_&> *)local_518);
    if (local_510 == (undefined1  [8])0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13]>
                (&local_520,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5a8,FAILED,"responseOrProtocolError.tryGet<HttpHeaders::Response>() != nullptr",
                 "\"bad response\"",(char (*) [13])"bad response");
      kj::_::Debug::Fault::fatal(&local_520);
    }
    ppRVar4 = mv<kj::HttpHeaders::Response*>((Response **)local_510);
    body.ptr = (AsyncInputStream *)*ppRVar4;
    response.statusText.content.ptr = (char *)(((Response *)body.ptr)->statusText).content.size_;
    _kj_result = *(Response **)body.ptr;
    response._0_8_ = (((Response *)body.ptr)->statusText).content.ptr;
    OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod&,int>
              ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)this_02,(HttpMethod *)(puVar3 + 0xa2))
    ;
    getEntityBody((HttpInputStreamImpl *)local_538,(RequestOrResponse)puVar3[0xa1],
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x1,(uint)this_02,
                  (HttpHeaders *)((ulong)_kj_result & 0xffffffff));
    lVar1 = puVar3[0xa1];
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(this_02);
    value->statusCode = (uint)_kj_result;
    puVar3[0x95] = response._0_8_;
    puVar3[0x96] = response.statusText.content.ptr;
    puVar3[0x97] = lVar1 + 0x48;
    other = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                      ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_538);
    Own<kj::AsyncInputStream,_std::nullptr_t>::Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)(puVar3 + 0x98),other);
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpInputStream::Response>,_kj::HttpInputStream::Response>::
    return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpInputStream::Response>,_kj::HttpInputStream::Response>
                  *)this_00,value);
    HttpInputStream::Response::~Response(value);
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_538);
    OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>::~OneOf
              ((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)(puVar3 + 0x8c));
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x51a));
    if (bVar2) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x51a));
      kj::_::Coroutine<kj::HttpInputStream::Response>::~Coroutine(this_00);
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,0x520);
      }
    }
    else {
      *puVar3 = 0;
      *(undefined1 *)(puVar3 + 0xa3) = 2;
      _GLOBAL__N_1::HttpInputStreamImpl::readResponse
                ((void *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),pvVar5);
    }
  }
  else {
    *(undefined1 *)(puVar3 + 0xa3) = 0;
    _GLOBAL__N_1::HttpInputStreamImpl::readResponse
              ((void *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),pvVar5);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Response> readResponse(HttpMethod requestMethod) override {
    auto responseOrProtocolError = co_await readResponseHeaders();
    auto response = KJ_REQUIRE_NONNULL(
        responseOrProtocolError.tryGet<HttpHeaders::Response>(), "bad response");
    auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, requestMethod,
                              response.statusCode, headers);

    co_return { response.statusCode, response.statusText, headers, kj::mv(body) };
  }